

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_worker_postMessage(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  uint8_t *__src;
  long *__ptr;
  void *__dest;
  ssize_t sVar7;
  ulong uVar8;
  uint8_t ch;
  uint8_t **sab_tab;
  size_t sab_tab_len;
  size_t data_len;
  undefined1 local_59;
  uint8_t **local_58;
  size_t local_50;
  void *local_48;
  size_t local_40;
  size_t local_38;
  
  pvVar6 = JS_GetOpaque2(ctx,this_val,js_worker_class_id);
  uVar8 = 6;
  if (pvVar6 != (void *)0x0) {
    __src = JS_WriteObject2(ctx,&local_38,*argv,0xc,&local_58,&local_40);
    if (__src != (uint8_t *)0x0) {
      __ptr = (long *)malloc(0x30);
      if (__ptr != (long *)0x0) {
        __ptr[2] = 0;
        __ptr[4] = 0;
        local_48 = pvVar6;
        pvVar6 = malloc(local_38);
        __ptr[2] = (long)pvVar6;
        if (pvVar6 != (void *)0x0) {
          memcpy(pvVar6,__src,local_38);
          __ptr[3] = local_38;
          local_50 = local_40;
          __dest = malloc(local_40 * 8);
          __ptr[4] = (long)__dest;
          if (__dest != (void *)0x0) {
            memcpy(__dest,local_58,local_40 * 8);
            __ptr[5] = local_50;
            js_free(ctx,__src);
            js_free(ctx,local_58);
            if (__ptr[5] != 0) {
              uVar8 = 0;
              do {
                LOCK();
                piVar1 = (int *)(*(long *)(__ptr[4] + uVar8 * 8) + -8);
                *piVar1 = *piVar1 + 1;
                UNLOCK();
                uVar8 = uVar8 + 1;
              } while (uVar8 < (ulong)__ptr[5]);
            }
            lVar3 = *(long *)((long)local_48 + 8);
            pthread_mutex_lock((pthread_mutex_t *)(lVar3 + 8));
            plVar2 = (long *)(lVar3 + 0x30);
            if (*(long **)(lVar3 + 0x38) == plVar2) {
              local_59 = 0;
              do {
                sVar7 = write(*(int *)(lVar3 + 0x44),&local_59,1);
                if ((int)sVar7 == 1) break;
              } while (-1 < (int)sVar7);
            }
            lVar4 = *plVar2;
            *(long **)(lVar4 + 8) = __ptr;
            *__ptr = lVar4;
            __ptr[1] = (long)plVar2;
            *plVar2 = (long)__ptr;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + 8));
            uVar8 = 3;
            goto LAB_00113503;
          }
        }
        free(pvVar6);
        free((void *)__ptr[4]);
        free(__ptr);
      }
      js_free(ctx,__src);
      js_free(ctx,local_58);
    }
  }
LAB_00113503:
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar8;
  return (JSValue)(auVar5 << 0x40);
}

Assistant:

static JSValue js_worker_postMessage(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSWorkerData *worker = JS_GetOpaque2(ctx, this_val, js_worker_class_id);
    JSWorkerMessagePipe *ps;
    size_t data_len, sab_tab_len, i;
    uint8_t *data;
    JSWorkerMessage *msg;
    uint8_t **sab_tab;
    
    if (!worker)
        return JS_EXCEPTION;
    
    data = JS_WriteObject2(ctx, &data_len, argv[0],
                           JS_WRITE_OBJ_SAB | JS_WRITE_OBJ_REFERENCE,
                           &sab_tab, &sab_tab_len);
    if (!data)
        return JS_EXCEPTION;

    msg = malloc(sizeof(*msg));
    if (!msg)
        goto fail;
    msg->data = NULL;
    msg->sab_tab = NULL;

    /* must reallocate because the allocator may be different */
    msg->data = malloc(data_len);
    if (!msg->data)
        goto fail;
    memcpy(msg->data, data, data_len);
    msg->data_len = data_len;

    msg->sab_tab = malloc(sizeof(msg->sab_tab[0]) * sab_tab_len);
    if (!msg->sab_tab)
        goto fail;
    memcpy(msg->sab_tab, sab_tab, sizeof(msg->sab_tab[0]) * sab_tab_len);
    msg->sab_tab_len = sab_tab_len;

    js_free(ctx, data);
    js_free(ctx, sab_tab);
    
    /* increment the SAB reference counts */
    for(i = 0; i < msg->sab_tab_len; i++) {
        js_sab_dup(NULL, msg->sab_tab[i]);
    }

    ps = worker->send_pipe;
    pthread_mutex_lock(&ps->mutex);
    /* indicate that data is present */
    if (list_empty(&ps->msg_queue)) {
        uint8_t ch = '\0';
        int ret;
        for(;;) {
            ret = write(ps->write_fd, &ch, 1);
            if (ret == 1)
                break;
            if (ret < 0 && (errno != EAGAIN || errno != EINTR))
                break;
        }
    }
    list_add_tail(&msg->link, &ps->msg_queue);
    pthread_mutex_unlock(&ps->mutex);
    return JS_UNDEFINED;
 fail:
    if (msg) {
        free(msg->data);
        free(msg->sab_tab);
        free(msg);
    }
    js_free(ctx, data);
    js_free(ctx, sab_tab);
    return JS_EXCEPTION;
    
}